

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExecutionQueue.cpp
# Opt level: O0

bool __thiscall
llbuild::basic::ExecutionQueue::executeShellCommand
          (ExecutionQueue *this,QueueJobContext *context,StringRef command)

{
  initializer_list<llvm::StringRef> __l;
  undefined8 context_00;
  ProcessStatus PVar1;
  size_t local_520;
  ArrayRef<llvm::StringRef> local_4e8;
  allocator<llvm::StringRef> local_4d1;
  StringRef local_4d0;
  char *local_4c0;
  size_t local_4b8;
  char *local_4b0;
  size_t local_4a8;
  iterator local_4a0;
  size_type local_498;
  undefined1 local_490 [8];
  vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> commandLine;
  undefined1 local_468 [8];
  SmallString<1024U> commandStorage;
  QueueJobContext *context_local;
  ExecutionQueue *this_local;
  StringRef command_local;
  
  commandLine.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)command.Data;
  commandStorage.super_SmallVector<char,_1024U>.super_SmallVectorStorage<char,_1024U>.InlineElts.
  _1016_8_ = context;
  llvm::SmallString<1024U>::SmallString((SmallString<1024U> *)local_468,command);
  local_4d0.Data = (char *)std::__cxx11::string::data();
  local_4d0.Length = std::__cxx11::string::length();
  local_4c0 = "-c";
  local_4b8 = strlen("-c");
  local_4b0 = llvm::SmallString<1024U>::c_str((SmallString<1024U> *)local_468);
  if (local_4b0 == (char *)0x0) {
    local_520 = 0;
  }
  else {
    local_520 = strlen(local_4b0);
  }
  local_4a8 = local_520;
  local_4a0 = &local_4d0;
  local_498 = 3;
  std::allocator<llvm::StringRef>::allocator(&local_4d1);
  __l._M_len = local_498;
  __l._M_array = local_4a0;
  std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::vector
            ((vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *)local_490,__l,&local_4d1);
  std::allocator<llvm::StringRef>::~allocator(&local_4d1);
  context_00 = commandStorage.super_SmallVector<char,_1024U>.super_SmallVectorStorage<char,_1024U>.
               InlineElts._1016_8_;
  llvm::ArrayRef<llvm::StringRef>::ArrayRef<std::allocator<llvm::StringRef>>
            (&local_4e8,(vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *)local_490);
  PVar1 = executeProcess(this,(QueueJobContext *)context_00,local_4e8);
  std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::~vector
            ((vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *)local_490);
  llvm::SmallString<1024U>::~SmallString((SmallString<1024U> *)local_468);
  return PVar1 == Succeeded;
}

Assistant:

bool ExecutionQueue::executeShellCommand(QueueJobContext* context,
                                         StringRef command) {
  SmallString<1024> commandStorage(command);
  std::vector<StringRef> commandLine(
#if defined(_WIN32)
      {"C:\\windows\\system32\\cmd.exe", "/C", commandStorage.c_str()});
#else
      {DefaultShellPath, "-c", commandStorage.c_str()});
#endif
  return executeProcess(context, commandLine) == ProcessStatus::Succeeded;
}

ExecutionQueueDelegate::~ExecutionQueueDelegate() {
}